

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwebsockets.c
# Opt level: O1

int lws_strexp_expand(lws_strexp_t *exp,char *in,size_t len,size_t *pused_in,size_t *pused_out)

{
  char cVar1;
  byte bVar2;
  size_t sVar3;
  int iVar4;
  size_t sVar5;
  
  if (len == 0) {
    len = 0;
  }
  else {
    sVar5 = 0;
    do {
      switch(exp->state) {
      case '\0':
        cVar1 = in[sVar5];
        if (cVar1 == '$') {
          exp->state = '\x01';
        }
        else {
          sVar3 = exp->pos;
          exp->pos = sVar3 + 1;
          exp->out[sVar3] = cVar1;
          if (exp->olen == exp->pos) {
            len = sVar5 + 1;
            iVar4 = 1;
            goto LAB_0010f3f8;
          }
        }
        break;
      case '\x01':
        if (in[sVar5] != '{') {
          sVar3 = exp->pos;
          if (exp->olen - sVar3 < 3) {
            return -1;
          }
          exp->pos = sVar3 + 1;
          exp->out[sVar3] = '$';
          cVar1 = in[sVar5];
          sVar3 = exp->pos;
          exp->pos = sVar3 + 1;
          exp->out[sVar3] = cVar1;
          if (in[sVar5] == '$') break;
          goto LAB_0010f334;
        }
        exp->name_pos = '\0';
        exp->state = '\x02';
        break;
      case '\x02':
        cVar1 = in[sVar5];
        if (cVar1 == '}') {
          exp->name[exp->name_pos] = '\0';
          exp->state = '\x03';
          goto switchD_0010f2c2_caseD_3;
        }
        bVar2 = exp->name_pos;
        if (0x1e < (ulong)bVar2) {
          return -1;
        }
        exp->name_pos = bVar2 + 1;
        exp->name[bVar2] = cVar1;
        break;
      case '\x03':
switchD_0010f2c2_caseD_3:
        *pused_in = sVar5;
        iVar4 = (*exp->cb)(exp->priv,exp->name,exp->out,&exp->pos,exp->olen,&exp->exp_ofs);
        *pused_out = exp->pos;
        if (iVar4 == -2) {
          return -2;
        }
        if (iVar4 == 1) {
          return 1;
        }
LAB_0010f334:
        exp->state = '\0';
      }
      sVar5 = sVar5 + 1;
    } while (len != sVar5);
  }
  iVar4 = 0;
  exp->out[exp->pos] = '\0';
LAB_0010f3f8:
  *pused_in = len;
  *pused_out = exp->pos;
  return iVar4;
}

Assistant:

int
lws_strexp_expand(lws_strexp_t *exp, const char *in, size_t len,
		  size_t *pused_in, size_t *pused_out)
{
	size_t used = 0;
	int n;

	while (used < len) {

		switch (exp->state) {
		case LWS_EXPS_LITERAL:
			if (*in == '$') {
				exp->state = LWS_EXPS_OPEN_OR_LIT;
				break;
			}

			exp->out[exp->pos++] = *in;
			if (exp->olen - exp->pos < 1) {
				*pused_in = used + 1;
				*pused_out = exp->pos;
				return LSTRX_FILLED_OUT;
			}
			break;

		case LWS_EXPS_OPEN_OR_LIT:
			if (*in == '{') {
				exp->state = LWS_EXPS_NAME_OR_CLOSE;
				exp->name_pos = 0;
				break;
			}
			/* treat as a literal */
			if (exp->olen - exp->pos < 3)
				return -1;

			exp->out[exp->pos++] = '$';
			exp->out[exp->pos++] = *in;
			if (*in != '$')
				exp->state = LWS_EXPS_LITERAL;
			break;

		case LWS_EXPS_NAME_OR_CLOSE:
			if (*in == '}') {
				exp->name[exp->name_pos] = '\0';
				exp->state = LWS_EXPS_DRAIN;
				goto drain;
			}
			if (exp->name_pos >= sizeof(exp->name) - 1)
				return LSTRX_FATAL_NAME_TOO_LONG;

			exp->name[exp->name_pos++] = *in;
			break;

		case LWS_EXPS_DRAIN:
drain:
			*pused_in = used;
			n = exp->cb(exp->priv, exp->name, exp->out, &exp->pos,
				    exp->olen, &exp->exp_ofs);
			*pused_out = exp->pos;
			if (n == LSTRX_FILLED_OUT ||
			    n == LSTRX_FATAL_NAME_UNKNOWN)
				return n;

			exp->state = LWS_EXPS_LITERAL;
			break;
		}

		used++;
		in++;
	}

	exp->out[exp->pos] = '\0';
	*pused_in = used;
	*pused_out = exp->pos;

	return LSTRX_DONE;
}